

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O1

void __thiscall absl::flags_internal::FlagImpl::Write(FlagImpl *this,void *src)

{
  FlagOpFn p_Var1;
  DynValueDeleter DVar2;
  Mutex *this_00;
  char *pcVar3;
  void *pvVar4;
  void *pvVar5;
  AlphaNum *in_R9;
  string src_as_str;
  string ignored_error;
  char *local_150;
  FlagOpFn local_148;
  char local_140;
  undefined7 uStack_13f;
  undefined1 *local_130;
  undefined8 local_128;
  undefined1 local_120;
  undefined7 uStack_11f;
  string local_110;
  DynValueDeleter local_f0;
  char *local_e8;
  AlphaNum local_c0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  this_00 = DataGuard(this);
  Mutex::Lock(this_00);
  pcVar3 = (char *)(*this->op_)(kFastTypeId,(void *)0x0,(void *)0x0,(void *)0x0);
  if (((((pcVar3 != "") && (pcVar3 != "")) && (pcVar3 != "")) &&
      (((pcVar3 != "" && (pcVar3 != "")) && ((pcVar3 != "" && ((pcVar3 != "" && (pcVar3 != "")))))))
      ) && ((pcVar3 != "" &&
            ((((pcVar3 != "" && (pcVar3 != "")) && (pcVar3 != "")) && (pcVar3 != "")))))) {
    p_Var1 = this->op_;
    pvVar4 = (*p_Var1)(kAlloc,(void *)0x0,(void *)0x0,(void *)0x0);
    (*p_Var1)(kCopyConstruct,src,pvVar4,(void *)0x0);
    DynValueDeleter::DynValueDeleter(&local_f0,this->op_);
    DVar2.op = local_f0.op;
    local_130 = &local_120;
    local_128 = 0;
    local_120 = 0;
    local_150 = &local_140;
    local_148 = (FlagOpFn)0x0;
    local_140 = '\0';
    (*this->op_)(kUnparse,src,&local_150,(void *)0x0);
    local_f0.op = local_148;
    local_e8 = local_150;
    pvVar5 = (*this->op_)(kParse,&local_f0,pvVar4,&local_130);
    if (pvVar5 == (void *)0x0) {
      local_f0.op = (FlagOpFn)0x15;
      local_e8 = "Attempt to set flag \'";
      pcVar3 = this->name_;
      local_60.piece_._M_len = strlen(pcVar3);
      local_90.piece_._M_len = 0x13;
      local_90.piece_._M_str = "\' to invalid value ";
      local_c0.piece_._M_len = (size_t)local_148;
      local_c0.piece_._M_str = local_150;
      local_60.piece_._M_str = pcVar3;
      StrCat_abi_cxx11_(&local_110,(absl *)&local_f0,&local_60,&local_90,&local_c0,in_R9);
      (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                (2,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/flags/internal/flag.cc"
                 ,0x200,&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_150 != &local_140) {
      operator_delete(local_150,CONCAT71(uStack_13f,local_140) + 1);
    }
    if (local_130 != &local_120) {
      operator_delete(local_130,CONCAT71(uStack_11f,local_120) + 1);
    }
    if (DVar2.op != (FlagOpFn)0x0 && pvVar4 != (void *)0x0) {
      (*DVar2.op)(kDelete,(void *)0x0,pvVar4,(void *)0x0);
    }
  }
  StoreValue(this,src);
  Mutex::Unlock(this_00);
  return;
}

Assistant:

void FlagImpl::Write(const void* src) {
  absl::MutexLock l(DataGuard());

  if (ShouldValidateFlagValue(flags_internal::FastTypeId(op_))) {
    std::unique_ptr<void, DynValueDeleter> obj{flags_internal::Clone(op_, src),
                                               DynValueDeleter{op_}};
    std::string ignored_error;
    std::string src_as_str = flags_internal::Unparse(op_, src);
    if (!flags_internal::Parse(op_, src_as_str, obj.get(), &ignored_error)) {
      ABSL_INTERNAL_LOG(ERROR, absl::StrCat("Attempt to set flag '", Name(),
                                            "' to invalid value ", src_as_str));
    }
  }

  StoreValue(src);
}